

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nihgui.cpp
# Opt level: O2

void __thiscall Dialog::run_step(Dialog *this,bool block)

{
  EventHandler *pEVar1;
  char cVar2;
  undefined7 in_register_00000031;
  ALLEGRO_EVENT event;
  ALLEGRO_MOUSE_EVENT local_58;
  
  if ((int)CONCAT71(in_register_00000031,block) != 0) {
    al_wait_for_event(this->event_queue,0);
  }
  while (cVar2 = al_get_next_event(this->event_queue,&local_58), cVar2 != '\0') {
    if (local_58.type == 0xb) {
      on_key_down(this,(ALLEGRO_KEYBOARD_EVENT *)&local_58);
    }
    else if (local_58.type == 0x14) {
      on_mouse_axes(this,&local_58);
    }
    else if (local_58.type == 0x15) {
      on_mouse_button_down(this,&local_58);
    }
    else if (local_58.type == 0x16) {
      on_mouse_button_up(this,&local_58);
    }
    else if (local_58.type == 0x28) {
      this->draw_requested = true;
    }
    else if (local_58.type == 0x2a) {
      this->quit_requested = true;
    }
    else {
      pEVar1 = this->event_handler;
      if (pEVar1 != (EventHandler *)0x0) {
        (**(code **)(*(long *)pEVar1 + 0x10))(pEVar1,&local_58);
      }
    }
  }
  return;
}

Assistant:

void Dialog::run_step(bool block)
{
   ALLEGRO_EVENT event;

   if (block) {
      al_wait_for_event(event_queue, NULL);
   }

   while (al_get_next_event(event_queue, &event)) {
      switch (event.type) {
         case ALLEGRO_EVENT_DISPLAY_CLOSE:
            this->request_quit();
            break;

         case ALLEGRO_EVENT_KEY_CHAR:
            on_key_down(event.keyboard);
            break;

         case ALLEGRO_EVENT_MOUSE_AXES:
            on_mouse_axes(event.mouse);
            break;

         case ALLEGRO_EVENT_MOUSE_BUTTON_DOWN:
            on_mouse_button_down(event.mouse);
            break;

         case ALLEGRO_EVENT_MOUSE_BUTTON_UP:
            on_mouse_button_up(event.mouse);
            break;

         case ALLEGRO_EVENT_DISPLAY_EXPOSE:
            this->request_draw();
            break;

         default:
            if (event_handler) {
               event_handler->handle_event(event);
            }
            break;
      }
   }
}